

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_acoustics.c
# Opt level: O0

t_float dbtopow(t_float f)

{
  double dVar1;
  undefined4 local_10;
  undefined4 local_c;
  t_float f_local;
  
  if (0.0 < f) {
    local_10 = f;
    if (870.0 < f) {
      local_10 = 870.0;
    }
    dVar1 = exp(((double)local_10 - 100.0) * 0.2302585092994046);
    local_c = (float)dVar1;
  }
  else {
    local_c = 0.0;
  }
  return local_c;
}

Assistant:

t_float dbtopow(t_float f)
{
    if (f <= 0)
        return(0);
    else
    {
        if (f > 870)
            f = 870;
        return (exp((LOGTEN * 0.1) * (f-100.)));
    }
}